

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall CommandBlock::Launch(CommandBlock *this)

{
  uint uVar1;
  Process *this_00;
  undefined8 uVar2;
  Config local_a0;
  function<void_(const_char_*,_unsigned_long)> local_90;
  function<void_(const_char_*,_unsigned_long)> local_70;
  allocator local_39;
  string_type local_38;
  anon_class_8_1_8991fb9c local_18;
  anon_class_8_1_8991fb9c clb;
  CommandBlock *this_local;
  
  clb.this = this;
  uVar1 = (*(this->super_Block)._vptr_Block[4])();
  if ((uVar1 & 1) != 0) {
    (*(this->super_Block)._vptr_Block[3])();
  }
  std::__cxx11::string::clear();
  local_18.this = this;
  this_00 = (Process *)operator_new(0xd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  std::function<void(char_const*,unsigned_long)>::
  function<CommandBlock::Launch()::_lambda(char_const*,unsigned_long)_1_&,void>
            ((function<void(char_const*,unsigned_long)> *)&local_70,&local_18);
  std::function<void_(const_char_*,_unsigned_long)>::function(&local_90,(nullptr_t)0x0);
  memset(&local_a0,0,0x10);
  TinyProcessLib::Config::Config(&local_a0);
  TinyProcessLib::Process::Process
            (this_00,&this->command,&local_38,&local_70,&local_90,false,&local_a0);
  this->process = this_00;
  std::function<void_(const_char_*,_unsigned_long)>::~function(&local_90);
  std::function<void_(const_char_*,_unsigned_long)>::~function(&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar2 = std::__cxx11::string::c_str();
  printf("%s\n",uVar2);
  return;
}

Assistant:

virtual void Launch() override
    {
        if (IsRunning())
        {
            Stop();
        }
        consoleOutput.clear();
        auto clb = [this](const char *bytes, size_t n) {
            consoleOutput += std::string(bytes, n);
        };
        process = new Process(command, "", clb);
        printf("%s\n", command.c_str());
    }